

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.h
# Opt level: O3

ImageView * __thiscall
ZXing::ImageView::rotated(ImageView *__return_storage_ptr__,ImageView *this,int degree)

{
  undefined4 uVar1;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  int pixStride;
  ImageFormat IVar5;
  int iVar6;
  
  iVar3 = (int)((ulong)((long)(degree + 0x168) * -0x49f49f49) >> 0x20) + degree + 0x168;
  iVar3 = degree + 0x168 + ((iVar3 >> 8) - (iVar3 >> 0x1f)) * -0x168;
  if (iVar3 == 0x10e) {
    iVar4 = this->_width;
    puVar2 = this->_data + (iVar4 + -1) * this->_pixStride;
    IVar5 = this->_format;
    iVar3 = this->_height;
    iVar6 = -this->_pixStride;
    pixStride = this->_rowStride;
  }
  else if (iVar3 == 0xb4) {
    IVar5 = this->_format;
    iVar3 = this->_width;
    iVar4 = this->_height;
    puVar2 = this->_data +
             (long)((iVar3 + -1) * this->_pixStride) + (long)((iVar4 + -1) * this->_rowStride);
    iVar6 = -this->_rowStride;
    pixStride = -this->_pixStride;
  }
  else {
    if (iVar3 != 0x5a) {
      puVar2 = this->_data;
      IVar5 = this->_format;
      iVar6 = this->_width;
      iVar3 = this->_pixStride;
      iVar4 = this->_rowStride;
      uVar1 = *(undefined4 *)&this->field_0x1c;
      __return_storage_ptr__->_height = this->_height;
      __return_storage_ptr__->_pixStride = iVar3;
      __return_storage_ptr__->_rowStride = iVar4;
      *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar1;
      __return_storage_ptr__->_data = puVar2;
      __return_storage_ptr__->_format = IVar5;
      __return_storage_ptr__->_width = iVar6;
      return __return_storage_ptr__;
    }
    iVar3 = this->_height;
    puVar2 = this->_data + (iVar3 + -1) * this->_rowStride;
    IVar5 = this->_format;
    iVar4 = this->_width;
    iVar6 = this->_pixStride;
    pixStride = -this->_rowStride;
  }
  ImageView(__return_storage_ptr__,puVar2,iVar3,iVar4,IVar5,iVar6,pixStride);
  return __return_storage_ptr__;
}

Assistant:

ImageView rotated(int degree) const
	{
		switch ((degree + 360) % 360) {
		case 90:  return {data(0, _height - 1), _height, _width, _format, _pixStride, -_rowStride};
		case 180: return {data(_width - 1, _height - 1), _width, _height, _format, -_rowStride, -_pixStride};
		case 270: return {data(_width - 1, 0), _height, _width, _format, -_pixStride, _rowStride};
		}
		return *this;
	}